

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O3

_Bool monster_attack_monster(monster_conflict *mon,monster_conflict *t_mon)

{
  loc grid;
  monster_race *pmVar1;
  monster_blow *pmVar2;
  blow_method *pbVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  byte bVar8;
  _Bool _Var9;
  _Bool _Var10;
  int iVar11;
  wchar_t wVar12;
  uint32_t uVar13;
  monster_lore *lore;
  melee_effect_handler_f p_Var14;
  monster *pmVar15;
  wchar_t rlev;
  byte bVar16;
  wchar_t wVar17;
  long lVar18;
  ulong uVar19;
  source sVar20;
  random_value v;
  random_value dice;
  source origin;
  melee_effect_handler_context_t context;
  char m_name [80];
  char t_name [80];
  
  lore = get_lore(mon->race);
  wVar17 = mon->race->level;
  rlev = L'\x01';
  if (L'\x01' < wVar17) {
    rlev = wVar17;
  }
  _Var9 = flag_has_dbg(mon->race->flags,0xc,0x1a,"mon->race->flags","RF_NEVER_BLOW");
  if (!_Var9) {
    monster_desc(m_name,0x50,(monster *)mon,L'̔');
    monster_desc(t_name,0x50,(monster *)t_mon,L'\x15');
    if (z_info->mon_blows_max != 0) {
      lVar18 = 0;
      uVar19 = 0;
      bVar8 = 0;
      do {
        grid = t_mon->grid;
        _Var10 = monster_is_visible((monster *)mon);
        pmVar1 = mon->race;
        bVar7 = true;
        if (!_Var10) {
          bVar7 = L'\0' < pmVar1->light;
        }
        pmVar2 = pmVar1->blow;
        pbVar3 = *(blow_method **)((long)&pmVar2->method + lVar18);
        if (pbVar3 == (blow_method *)0x0) break;
        puVar4 = *(undefined8 **)((long)&pmVar2->effect + lVar18);
        if (puVar4 == (undefined8 *)0x0) {
          __assert_fail("effect",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-attack.c"
                        ,0x362,"_Bool monster_attack_monster(struct monster *, struct monster *)");
        }
        uVar5 = *(undefined8 *)((long)&(pmVar2->dice).base + lVar18);
        uVar6 = *(undefined8 *)((long)&(pmVar2->dice).sides + lVar18);
        iVar11 = strcmp((char *)*puVar4,"NONE");
        if (iVar11 != 0) {
          iVar11 = pmVar1->level * 3;
          if (pmVar1->level < L'\x01') {
            iVar11 = 3;
          }
          wVar17 = iVar11 + *(int *)(puVar4 + 1);
          if (mon->m_timed[1] != 0) {
            wVar17 = (wVar17 * 0x4b) / 100;
          }
          _Var10 = test_hit(wVar17,t_mon->race->ac);
          if (_Var10) goto LAB_0016f14f;
          _Var10 = monster_is_visible((monster *)mon);
          if ((_Var10) && (pbVar3->miss == true)) {
            msg("%s misses %s.",m_name,t_name);
          }
          bVar16 = 0;
          goto LAB_0016f35c;
        }
LAB_0016f14f:
        _Var10 = pbVar3->stun;
        v.sides = (int)uVar6;
        v.m_bonus = (int)((ulong)uVar6 >> 0x20);
        v.base = (int)uVar5;
        v.dice = (int)((ulong)uVar5 >> 0x20);
        wVar17 = randcalc(v,rlev,RANDOMISE);
        if (mon->m_timed[1] != 0) {
          wVar17 = (wVar17 * 0x4b) / 100;
        }
        p_Var14 = melee_handler_for_blow_effect((char *)*puVar4);
        if (p_Var14 == (melee_effect_handler_f)0x0) {
          msg("ERROR: Effect handler not found for %s.",*puVar4);
          bVar16 = 1;
        }
        else {
          context.p = (player *)0x0;
          context.ac = t_mon->race->ac;
          context.ddesc = (char *)0x0;
          context.obvious = true;
          context.blinked = (_Bool)(bVar8 & 1);
          context.m_name = m_name;
          context.mon = mon;
          context.t_mon = t_mon;
          context.rlev = rlev;
          context.method = pbVar3;
          context.damage = wVar17;
          (*p_Var14)(&context);
          wVar17 = context.damage;
          bVar16 = context.obvious;
          bVar8 = context.blinked;
        }
        if ((_Var10 == false) || (pmVar15 = square_monster(cave,grid), pmVar15 == (monster *)0x0))
        goto switchD_0016f2e0_caseD_0;
        dice.sides = (int)uVar6;
        dice.m_bonus = (int)((ulong)uVar6 >> 0x20);
        dice.base = (int)uVar5;
        dice.dice = (int)((ulong)uVar5 >> 0x20);
        wVar12 = monster_critical(dice,rlev,wVar17);
        switch(wVar12) {
        case L'\0':
          goto switchD_0016f2e0_caseD_0;
        case L'\x01':
          uVar13 = 5;
          break;
        case L'\x02':
          wVar12 = L'\v';
          uVar13 = 10;
          break;
        case L'\x03':
          wVar12 = L'\x15';
          uVar13 = 0x14;
          break;
        case L'\x04':
          wVar12 = L'\x1f';
          uVar13 = 0x1e;
          break;
        case L'\x05':
          wVar12 = L')';
          uVar13 = 0x28;
          break;
        case L'\x06':
          wVar12 = L'd';
          goto LAB_0016f340;
        default:
          wVar12 = L'È';
          goto LAB_0016f340;
        }
        uVar13 = Rand_div(uVar13);
        wVar12 = uVar13 + wVar12;
        if (wVar12 != L'\0') {
LAB_0016f340:
          mon_inc_timed((monster *)t_mon,L'\x01',wVar12,L'\0');
        }
switchD_0016f2e0_caseD_0:
        bVar16 = bVar16 | wVar17 != L'\0';
LAB_0016f35c:
        if (bVar7) {
          iVar11 = *(int *)((long)&lore->blows->times_seen + lVar18);
          if (((bVar16 | 10 < iVar11) == 1) && (iVar11 < 0xff)) {
            *(int *)((long)&lore->blows->times_seen + lVar18) = iVar11 + 1;
          }
        }
        pmVar15 = square_monster(cave,grid);
        if (pmVar15 == (monster *)0x0) break;
        uVar19 = uVar19 + 1;
        lVar18 = lVar18 + 0x30;
      } while (uVar19 < z_info->mon_blows_max);
      if ((bVar8 & 1) != 0) {
        _Var10 = square_isseen(cave,mon->grid);
        if (_Var10) {
          add_monster_message(mon,L'7',true);
        }
        strnfmt((char *)&context,5,"%d",(ulong)((uint)z_info->max_sight * 2 + 5));
        sVar20 = source_monster(mon->midx);
        origin.which = sVar20.which;
        origin._4_4_ = 0;
        origin.what = sVar20.what;
        effect_simple(L';',origin,(char *)&context,L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
      }
    }
    lore_update(mon->race,lore);
  }
  return !_Var9;
}

Assistant:

bool monster_attack_monster(struct monster *mon, struct monster *t_mon)
{
	struct monster_lore *lore = get_lore(mon->race);
	int rlev = ((mon->race->level >= 1) ? mon->race->level : 1);
	int ap_cnt;
	char m_name[80];
	char t_name[80];
	bool blinked = false;

	/* Not allowed to attack */
	if (rf_has(mon->race->flags, RF_NEVER_BLOW)) return (false);

	/* Get the monster names (or "it") */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);
	monster_desc(t_name, sizeof(t_name), t_mon, MDESC_TARG);

	/* Scan through all blows */
	for (ap_cnt = 0; ap_cnt < z_info->mon_blows_max; ap_cnt++) {
		struct loc grid = t_mon->grid;
		bool visible = monster_is_visible(mon) || (mon->race->light > 0);
		bool obvious = false;

		int damage = 0;
		bool do_stun = false;

		/* Extract the attack infomation */
		struct blow_effect *effect = mon->race->blow[ap_cnt].effect;
		struct blow_method *method = mon->race->blow[ap_cnt].method;
		random_value dice = mon->race->blow[ap_cnt].dice;

		/* No more attacks */
		if (!method) break;

		/* Monster hits monster */
		assert(effect);
		if (streq(effect->name, "NONE") ||
			test_hit(chance_of_monster_hit(mon, effect), t_mon->race->ac)) {
			melee_effect_handler_f effect_handler;

			do_stun = method->stun;

			/* Hack -- assume all attacks are obvious */
			obvious = true;

			/* Roll dice */
			damage = randcalc(dice, rlev, RANDOMISE);

			/* Reduce damage when stunned */
			if (mon->m_timed[MON_TMD_STUN]) {
				damage = (damage * (100 - STUN_DAM_REDUCTION)) / 100;
			}

			/* Perform the actual effect. */
			effect_handler = melee_handler_for_blow_effect(effect->name);
			if (effect_handler != NULL) {
				melee_effect_handler_context_t context = {
					NULL,
					mon,
					t_mon,
					rlev,
					method,
					t_mon->race->ac,
					NULL,
					obvious,
					blinked,
					damage,
					m_name
				};

				effect_handler(&context);

				/* Save any changes made in the handler for later use. */
				obvious = context.obvious;
				blinked = context.blinked;
				damage = context.damage;
			} else {
				msg("ERROR: Effect handler not found for %s.", effect->name);
			}

			/* Handle stun */
			if (do_stun && square_monster(cave, grid)) {
				/* Critical hit (zero if non-critical) */
				int amt, tmp = monster_critical(dice, rlev, damage);

				/* Roll for damage */
				switch (tmp) {
					case 0: amt = 0; break;
					case 1: amt = randint1(5); break;
					case 2: amt = randint1(10) + 10; break;
					case 3: amt = randint1(20) + 20; break;
					case 4: amt = randint1(30) + 30; break;
					case 5: amt = randint1(40) + 40; break;
					case 6: amt = 100; break;
					default: amt = 200; break;
				}

				/* Apply the stun */
				if (amt)
					(void)mon_inc_timed(t_mon, MON_TMD_STUN, amt, 0);
			}
		} else {
			/* Visible monster missed monster, so notify if appropriate. */
			if (monster_is_visible(mon) && method->miss) {
				msg("%s misses %s.", m_name, t_name);
			}
		}

		/* Analyze "visible" monsters only */
		if (visible) {
			/* Count "obvious" attacks (and ones that cause damage) */
			if (obvious || damage || (lore->blows[ap_cnt].times_seen > 10)) {
				/* Count attacks of this type */
				if (lore->blows[ap_cnt].times_seen < UCHAR_MAX)
					lore->blows[ap_cnt].times_seen++;
			}
		}

		/* Skip the other blows if the target has moved or died */
		if (!square_monster(cave, grid)) break;
	}

	/* Blink away */
	if (blinked) {
		char dice[5];

		if (square_isseen(cave, mon->grid)) {
			add_monster_message(mon, MON_MSG_HIT_AND_RUN, true);
		}
		strnfmt(dice, sizeof(dice), "%d", z_info->max_sight * 2 + 5);
		effect_simple(EF_TELEPORT, source_monster(mon->midx), dice, 0, 0, 0, 0, 0, NULL);
	}

	/* Learn lore */
	lore_update(mon->race, lore);

	/* Assume we attacked */
	return (true);
}